

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O3

void Prs_CreateOutConcat(Cba_Ntk_t *p,int *pSlices,int nSlices)

{
  Cba_Man_t *pCVar1;
  Vec_Int_t *pVVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  Vec_Str_t *p_00;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  char *format;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  
  iVar7 = *pSlices;
  pCVar1 = p->pDesign;
  Vec_IntFillExtra(&pCVar1->vNameMap,iVar7 + 1,nSlices);
  if ((-1 < (long)iVar7) && (iVar7 < (pCVar1->vNameMap).nSize)) {
    iVar13 = (pCVar1->vNameMap).pArray[iVar7];
    if (iVar13 == 0) {
      __assert_fail("RangeId > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                    ,0x637,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
    }
    if (iVar13 < 1) {
      pVVar2 = p->pDesign->vHash->vObjs;
      uVar3 = iVar13 * -4;
      uVar15 = pVVar2->nSize;
      if (uVar15 != uVar3 && SBORROW4(uVar15,uVar3) == (int)(uVar15 + iVar13 * 4) < 0) {
        piVar8 = pVVar2->pArray;
        uVar15 = piVar8[uVar3];
        uVar3 = piVar8[(ulong)uVar3 + 1];
        uVar16 = uVar3;
        if ((int)uVar15 < (int)uVar3) {
          uVar16 = uVar15;
        }
        uVar14 = (ulong)uVar16;
        if ((int)uVar3 < (int)uVar15) {
          uVar3 = uVar15;
        }
        uVar15 = uVar3 + 1;
        if ((p->vArray1).nCap <= (int)uVar3) {
          piVar8 = (p->vArray1).pArray;
          if (piVar8 == (int *)0x0) {
            piVar8 = (int *)malloc((long)(int)uVar15 << 2);
          }
          else {
            piVar8 = (int *)realloc(piVar8,(long)(int)uVar15 << 2);
          }
          (p->vArray1).pArray = piVar8;
          if (piVar8 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          (p->vArray1).nCap = uVar15;
        }
        if (-1 < (int)uVar3) {
          memset((p->vArray1).pArray,0,(ulong)uVar15 << 2);
        }
        (p->vArray1).nSize = uVar15;
        if (0 < nSlices) {
          uVar9 = 0;
          do {
            iVar13 = pSlices[uVar9 * 3 + 1];
            iVar10 = pSlices[uVar9 * 3 + 2];
            uVar15 = 0;
            uVar12 = 0;
            if (iVar13 != 0) {
              if (iVar13 < 0) goto LAB_003e4135;
              pVVar2 = p->pDesign->vHash->vObjs;
              uVar12 = iVar13 * 4;
              if (pVVar2->nSize <= (int)uVar12) goto LAB_003e4135;
              piVar8 = pVVar2->pArray;
              uVar15 = piVar8[uVar12];
              uVar12 = piVar8[(ulong)uVar12 + 1];
            }
            uVar5 = uVar12;
            if ((int)uVar12 < (int)uVar15) {
              uVar5 = uVar15;
            }
            if ((iVar7 != pSlices[uVar9 * 3]) || (iVar10 < 1)) {
              __assert_fail("NameId == pSlices[3*i+0] && iFon > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                            ,0x642,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
            }
            if ((int)uVar15 < (int)uVar12) {
              uVar12 = uVar15;
            }
            uVar11 = (ulong)uVar12;
            if (((int)uVar12 < (int)uVar16) || ((int)uVar3 < (int)uVar5)) {
              __assert_fail("BotId <= Bot && Top <= TopId",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                            ,0x643,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
            }
            do {
              if (((int)uVar12 < 0) || (iVar13 = (int)uVar11, (p->vArray1).nSize <= iVar13))
              goto LAB_003e40f7;
              piVar8 = (p->vArray1).pArray;
              if (piVar8[uVar11] != 0) {
                __assert_fail("Vec_IntEntry(vBits, k) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                              ,0x646,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
              }
              piVar8[uVar11] = iVar10;
              uVar11 = uVar11 + 1;
            } while (iVar13 < (int)uVar5);
            uVar9 = uVar9 + 1;
          } while (uVar9 != (uint)nSlices);
        }
        iVar10 = 0;
        uVar9 = uVar14;
        iVar13 = -1;
        do {
          if (((int)uVar16 < 0) || (iVar4 = (int)uVar9, (p->vArray1).nSize <= iVar4))
          goto LAB_003e40f7;
          iVar6 = (p->vArray1).pArray[uVar9];
          iVar10 = iVar10 + (uint)(iVar13 != iVar6);
          uVar9 = uVar9 + 1;
          iVar13 = iVar6;
        } while (iVar4 < (int)uVar3);
        uVar15 = Cba_ObjAlloc(p,CBA_BOX_CONCAT,iVar10,1);
        if ((int)uVar15 < 1) {
          __assert_fail("i>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                        ,0xe8,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
        }
        if ((int)uVar15 < (p->vObjFon0).nSize) {
          iVar13 = (p->vObjFon0).pArray[uVar15];
          Cba_FonSetName(p,iVar13,iVar7);
          Prs_CreateRange(p,iVar13,iVar7);
          format = (char *)0x0;
          uVar16 = 0;
          iVar7 = -1;
          do {
            iVar13 = (int)uVar14;
            if ((p->vArray1).nSize <= iVar13) goto LAB_003e40f7;
            iVar4 = (p->vArray1).pArray[uVar14];
            if (iVar7 == iVar4 || iVar7 == -1) {
              uVar16 = uVar16 + 1;
            }
            else {
              uVar12 = (uint)format;
              if (iVar7 == 0) {
                p_00 = Abc_NamBuffer(p->pDesign->pStrs);
                Vec_StrPrintF(p_00,format,(ulong)uVar16,"");
                iVar7 = Abc_NamStrFindOrAdd(p->pDesign->pFuns,p_00->pArray,(int *)0x0);
              }
              uVar5 = Cba_FonRangeSize(p,iVar7);
              if (uVar16 != uVar5) {
                __assert_fail("nBits == Cba_FonRangeSize(p, Prev)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                              ,0x661,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
              }
              if ((p->vObjFin0).nSize <= (int)uVar15) goto LAB_003e40f7;
              iVar6 = ~uVar12 + iVar10;
              piVar8 = (p->vObjFin0).pArray + uVar15;
              uVar16 = iVar6 + *piVar8;
              if (uVar16 == 0 || SCARRY4(iVar6,*piVar8) != (int)uVar16 < 0) goto LAB_003e4192;
              if ((p->vFinFon).nSize <= (int)uVar16) goto LAB_003e40f7;
              piVar8 = (p->vFinFon).pArray;
              if (piVar8[uVar16] != 0) goto LAB_003e41b1;
              format = (char *)(ulong)(uVar12 + 1);
              piVar8[uVar16] = iVar7;
              uVar16 = 1;
            }
            uVar14 = uVar14 + 1;
            iVar7 = iVar4;
          } while (iVar13 < (int)uVar3);
          uVar3 = Cba_FonRangeSize(p,iVar4);
          if (uVar16 != uVar3) {
            __assert_fail("nBits == Cba_FonRangeSize(p, Prev)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x667,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
          }
          if ((int)uVar15 < (p->vObjFin0).nSize) {
            iVar7 = ~(uint)format + iVar10;
            piVar8 = (p->vObjFin0).pArray + uVar15;
            uVar15 = iVar7 + *piVar8;
            if (uVar15 == 0 || SCARRY4(iVar7,*piVar8) != (int)uVar15 < 0) {
LAB_003e4192:
              __assert_fail("f>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                            ,0xfc,"int Cba_FinFon(Cba_Ntk_t *, int)");
            }
            if ((int)uVar15 < (p->vFinFon).nSize) {
              piVar8 = (p->vFinFon).pArray;
              if (piVar8[uVar15] == 0) {
                piVar8[uVar15] = iVar4;
                if ((uint)format + 1 != iVar10) {
                  __assert_fail("k == nParts",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                                ,0x669,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
                }
                return;
              }
LAB_003e41b1:
              __assert_fail("Cba_ObjFinFon(p, i, k)== 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                            ,0x101,"void Cba_ObjSetFinFon(Cba_Ntk_t *, int, int, int)");
            }
          }
        }
        goto LAB_003e40f7;
      }
    }
LAB_003e4135:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
LAB_003e40f7:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Prs_CreateOutConcat( Cba_Ntk_t * p, int * pSlices, int nSlices )
{
    Vec_Int_t * vBits = &p->vArray1;
    int NameId    = pSlices[0];
    int RangeId   = -Cba_NtkGetMap(p, NameId);
    int LeftId    = Cba_NtkRangeLeft( p, RangeId );
    int RightId   = Cba_NtkRangeRight( p, RangeId );
    int BotId     = Abc_MinInt( LeftId, RightId );
    int TopId     = Abc_MaxInt( LeftId, RightId );
    int i, k, iObj, iFon, nParts, Prev, nBits;
    assert( RangeId > 0 );
    Vec_IntFill( vBits, Abc_MaxInt(LeftId, RightId) + 1, 0 );
    // fill up with slices
    for ( i = 0; i < nSlices; i++ )
    {
        int Range = pSlices[3*i+1];
        int iFon  = pSlices[3*i+2];
        int Left  = Cba_NtkRangeLeft( p, Range );
        int Right = Cba_NtkRangeRight( p, Range );
        int Bot   = Abc_MinInt( Left, Right );
        int Top   = Abc_MaxInt( Left, Right );
        assert( NameId == pSlices[3*i+0] && iFon > 0 );
        assert( BotId <= Bot && Top <= TopId );
        for ( k = Bot; k <= Top; k++ )
        {
            assert( Vec_IntEntry(vBits, k) == 0 );
            Vec_IntWriteEntry( vBits, k, iFon );
        }
    }
    // check how many parts we have
    Prev = -1; nParts = 0; 
    Vec_IntForEachEntryStartStop( vBits, iFon, i, BotId, TopId+1 )
    {
        if ( Prev != iFon )
            nParts++;
        Prev = iFon;
    }
    // create new concatenation
    iObj = Cba_ObjAlloc( p, CBA_BOX_CONCAT, nParts, 1 );
    iFon = Cba_ObjFon0(p, iObj);
    Cba_FonSetName( p, iFon, NameId );
    Prs_CreateRange( p, iFon, NameId );
    // set inputs
    k = 0; Prev = -1; nBits = 0;
    Vec_IntForEachEntryStartStop( vBits, iFon, i, BotId, TopId+1 )
    {
        if ( Prev == -1 || Prev == iFon )
            nBits++;
        else
        {
            if ( Prev == 0 ) // create constant
                Prev = Cba_ManNewConstZero( p, nBits );
            assert( nBits == Cba_FonRangeSize(p, Prev) );
            Cba_ObjSetFinFon( p, iObj, nParts-1-k++, Prev );
            nBits = 1;
        }
        Prev = iFon;         
    }
    assert( nBits == Cba_FonRangeSize(p, Prev) );
    Cba_ObjSetFinFon( p, iObj, nParts-1-k++, Prev );
    assert( k == nParts );
}